

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

void InitGammaTablesS_body(void)

{
  double dVar1;
  double value_1;
  double g_1;
  double a_rec;
  double value;
  double g;
  double final_scale;
  double thresh;
  double a;
  double scale;
  double norm;
  int v;
  double local_58;
  double local_40;
  int local_4;
  
  if (kGammaTablesSOk == 0) {
    for (local_4 = 0; local_4 < 0x400; local_4 = local_4 + 1) {
      local_40 = (double)local_4 * 0.0009775171065493646;
      if (0.08124285829863151 < local_40) {
        local_40 = pow((local_40 + 0.09929682680944) * 0.909672415686275,2.2222222222222223);
      }
      else {
        local_40 = local_40 / 4.5;
      }
      kGammaToLinearTabS[local_4] = (uint32_t)(long)(local_40 * 16384.0 + 0.5);
    }
    for (local_4 = 0; local_4 < 0x21; local_4 = local_4 + 1) {
      local_58 = (double)local_4 * 0.03125;
      if (0.018053968510807 < local_58) {
        dVar1 = pow(local_58,0.44999999999999996);
        local_58 = dVar1 * 1.09929682680944 + -0.09929682680944;
      }
      else {
        local_58 = local_58 * 4.5;
      }
      kLinearToGammaTabS[local_4] = (int)(long)(local_58 * 1023.0) + 0x2000;
    }
    kLinearToGammaTabS[0x21] = kLinearToGammaTabS[0x20];
    kGammaTablesSOk = 1;
  }
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(InitGammaTablesS) {
  assert(2 * GAMMA_TO_LINEAR_BITS < 32);  // we use uint32_t intermediate values
  if (!kGammaTablesSOk) {
    int v;
    const double norm = 1. / MAX_Y_T;
    const double scale = 1. / kGammaTabSize;
    const double a = 0.09929682680944;
    const double thresh = 0.018053968510807;
    const double final_scale = 1 << GAMMA_TO_LINEAR_BITS;
    for (v = 0; v <= MAX_Y_T; ++v) {
      const double g = norm * v;
      double value;
      if (g <= thresh * 4.5) {
        value = g / 4.5;
      } else {
        const double a_rec = 1. / (1. + a);
        value = pow(a_rec * (g + a), kGammaF);
      }
      kGammaToLinearTabS[v] = (uint32_t)(value * final_scale + .5);
    }
    for (v = 0; v <= kGammaTabSize; ++v) {
      const double g = scale * v;
      double value;
      if (g <= thresh) {
        value = 4.5 * g;
      } else {
        value = (1. + a) * pow(g, 1. / kGammaF) - a;
      }
      // we already incorporate the 1/2 rounding constant here
      kLinearToGammaTabS[v] =
          (uint32_t)(MAX_Y_T * value) + (1 << GAMMA_TO_LINEAR_BITS >> 1);
    }
    // to prevent small rounding errors to cause read-overflow:
    kLinearToGammaTabS[kGammaTabSize + 1] = kLinearToGammaTabS[kGammaTabSize];
    kGammaTablesSOk = 1;
  }
}